

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::ShaderMatrixCase::setupUniforms
          (ShaderMatrixCase *this,int programID,Vec4 *constCoords)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined8 *puVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  undefined4 *puVar10;
  undefined4 *puVar11;
  undefined1 *puVar12;
  long lVar13;
  long lVar14;
  long *local_220;
  long local_210;
  undefined4 uStack_208;
  undefined4 uStack_204;
  int local_1fc;
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8 [2];
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8 [2];
  ShaderMatrixCase *local_1b8;
  code *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  long lVar4;
  
  local_1fc = programID;
  local_1b8 = this;
  iVar2 = (*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  lVar9 = 0;
  puVar11 = &s_constInMat3x3;
  puVar12 = s_constInVec2;
  puVar10 = &s_constInFloat;
  lVar7 = 0;
  lVar13 = 0;
  iVar2 = 0;
  lVar14 = 0;
  do {
    lVar6 = 0x128;
    if (lVar14 == 0x30) {
      lVar6 = 0x134;
    }
    if (*(int *)((long)&(local_1b8->super_ShaderRenderCase).super_TestCase.super_TestNode.
                        _vptr_TestNode + lVar6) == 1) {
      local_1b0 = *(code **)(lVar4 + 0xb48);
      local_1f8 = local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"u_in","");
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,iVar2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar8 = 0xf;
      if (local_1f8 != local_1e8) {
        uVar8 = local_1e8[0];
      }
      if (uVar8 < (ulong)(local_1d0 + local_1f0)) {
        uVar8 = 0xf;
        if (local_1d8 != local_1c8) {
          uVar8 = local_1c8[0];
        }
        if (uVar8 < (ulong)(local_1d0 + local_1f0)) goto LAB_010b5bf6;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_1f8);
      }
      else {
LAB_010b5bf6:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_1d8);
      }
      local_220 = &local_210;
      plVar1 = puVar5 + 2;
      if ((long *)*puVar5 == plVar1) {
        local_210 = *plVar1;
        uStack_208 = *(undefined4 *)(puVar5 + 3);
        uStack_204 = *(undefined4 *)((long)puVar5 + 0x1c);
      }
      else {
        local_210 = *plVar1;
        local_220 = (long *)*puVar5;
      }
      *puVar5 = plVar1;
      puVar5[1] = 0;
      *(undefined1 *)plVar1 = 0;
      iVar3 = (*local_1b0)(local_1fc,local_220);
      if (local_220 != &local_210) {
        operator_delete(local_220,local_210 + 1);
      }
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8,local_1c8[0] + 1);
      }
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8,local_1e8[0] + 1);
      }
      if (-1 < iVar3) {
        switch(*(undefined4 *)
                ((long)&(local_1b8->super_ShaderRenderCase).super_TestCase.super_TestNode.
                        _vptr_TestNode + lVar6 + 4)) {
        case 1:
          (**(code **)(lVar4 + 0x14e0))(*puVar10,iVar3);
          break;
        case 2:
          (**(code **)(lVar4 + 0x1528))(iVar3,1,puVar12);
          break;
        case 3:
          (**(code **)(lVar4 + 0x1568))(iVar3,1);
          break;
        case 4:
          (**(code **)(lVar4 + 0x15a8))(iVar3,1,s_constInVec4 + lVar9);
          break;
        case 5:
          (**(code **)(lVar4 + 0x15e0))(iVar3,1,1,(long)&s_constInMat2x2 + lVar9);
          break;
        case 6:
          (**(code **)(lVar4 + 0x15f0))(iVar3,1,1,(long)&s_constInMat2x3 + lVar7);
          break;
        case 7:
          (**(code **)(lVar4 + 0x1600))(iVar3,1,1,(long)&s_constInMat2x4 + lVar13);
          break;
        case 8:
          (**(code **)(lVar4 + 0x1620))(iVar3,1,1,(long)&s_constInMat3x2 + lVar7);
          break;
        case 9:
          (**(code **)(lVar4 + 0x1610))(iVar3,1,1,puVar11);
          break;
        case 10:
          (**(code **)(lVar4 + 0x1630))(iVar3,1,1,(long)&s_constInMat3x4 + lVar14);
          break;
        case 0xb:
          (**(code **)(lVar4 + 0x1650))(iVar3,1,1,(long)&s_constInMat4x2 + lVar13);
          break;
        case 0xc:
          (**(code **)(lVar4 + 0x1660))(iVar3,1,1,(long)&s_constInMat4x3 + lVar14);
          break;
        case 0xd:
          (**(code **)(lVar4 + 0x1640))(iVar3,1,1);
        }
      }
    }
    lVar14 = lVar14 + 0x30;
    iVar2 = iVar2 + 1;
    lVar13 = lVar13 + 0x20;
    puVar11 = puVar11 + 9;
    lVar7 = lVar7 + 0x18;
    lVar9 = lVar9 + 0x10;
    puVar12 = puVar12 + 8;
    puVar10 = puVar10 + 1;
    if (lVar14 == 0x60) {
      return;
    }
  } while( true );
}

Assistant:

void ShaderMatrixCase::setupUniforms (int programID, const tcu::Vec4& constCoords)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	DE_UNREF(constCoords);

	for (int inNdx = 0; inNdx < 2; inNdx++)
	{
		const ShaderInput& in = inNdx > 0 ? m_in1 : m_in0;

		if (in.inputType == INPUTTYPE_UNIFORM)
		{
			int loc = gl.getUniformLocation(programID, (string("u_in") + de::toString(inNdx)).c_str());

			if (loc < 0)
				continue;

			switch (in.dataType)
			{
				case TYPE_FLOAT:		gl.uniform1f(loc, s_constInFloat[inNdx]);						break;
				case TYPE_FLOAT_VEC2:	gl.uniform2fv(loc, 1, s_constInVec2[inNdx].getPtr());			break;
				case TYPE_FLOAT_VEC3:	gl.uniform3fv(loc, 1, s_constInVec3[inNdx].getPtr());			break;
				case TYPE_FLOAT_VEC4:	gl.uniform4fv(loc, 1, s_constInVec4[inNdx].getPtr());			break;
				// \note GLES3 supports transpose in matrix upload.
				case TYPE_FLOAT_MAT2:	gl.uniformMatrix2fv	(loc, 1, GL_TRUE, s_constInMat2x2[inNdx]);	break;
				case TYPE_FLOAT_MAT2X3:	gl.uniformMatrix2x3fv(loc, 1, GL_TRUE, s_constInMat2x3[inNdx]);	break;
				case TYPE_FLOAT_MAT2X4:	gl.uniformMatrix2x4fv(loc, 1, GL_TRUE, s_constInMat2x4[inNdx]);	break;
				case TYPE_FLOAT_MAT3X2:	gl.uniformMatrix3x2fv(loc, 1, GL_TRUE, s_constInMat3x2[inNdx]);	break;
				case TYPE_FLOAT_MAT3:	gl.uniformMatrix3fv	(loc, 1, GL_TRUE, s_constInMat3x3[inNdx]);	break;
				case TYPE_FLOAT_MAT3X4:	gl.uniformMatrix3x4fv(loc, 1, GL_TRUE, s_constInMat3x4[inNdx]);	break;
				case TYPE_FLOAT_MAT4X2:	gl.uniformMatrix4x2fv(loc, 1, GL_TRUE, s_constInMat4x2[inNdx]);	break;
				case TYPE_FLOAT_MAT4X3:	gl.uniformMatrix4x3fv(loc, 1, GL_TRUE, s_constInMat4x3[inNdx]);	break;
				case TYPE_FLOAT_MAT4:	gl.uniformMatrix4fv	(loc, 1, GL_TRUE, s_constInMat4x4[inNdx]);	break;
				default:
					DE_ASSERT(false);
			}
		}
	}
}